

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.cpp
# Opt level: O0

bool GetPubKey(SigningProvider *provider,SignatureData *sigdata,CKeyID *address,CPubKey *pubkey)

{
  bool bVar1;
  byte bVar2;
  pointer ppVar3;
  pointer ppVar4;
  void *in_RCX;
  undefined8 in_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  const_iterator *tap_pk_it;
  const_iterator *pk_it;
  const_iterator it;
  key_type *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  _Self *in_stack_ffffffffffffff38;
  XOnlyPubKey *__x;
  XOnlyPubKey *this;
  bool local_81;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  undefined1 local_49 [65];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_58 = (_Base_ptr)
             std::
             map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ::find((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                    in_stack_ffffffffffffff28);
  local_60 = (_Base_ptr)
             std::
             map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
             ::end((map<CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_>
                    *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  bVar1 = std::operator==((_Self *)in_stack_ffffffffffffff38,
                          (_Self *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_68 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
               ::find((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                       *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                      in_stack_ffffffffffffff28);
    local_70 = (_Base_ptr)
               std::
               map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
               ::end((map<CKeyID,_std::pair<CPubKey,_KeyOriginInfo>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    bVar1 = std::operator==(in_stack_ffffffffffffff38,
                            (_Self *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_78 = (_Base_ptr)
                 std::
                 map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
                 ::find((map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
                         *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                        in_stack_ffffffffffffff28);
      __x = (XOnlyPubKey *)&local_78;
      this = __x;
      std::
      map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
      ::end((map<CKeyID,_XOnlyPubKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_XOnlyPubKey>_>_>
             *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
      bVar1 = std::operator==((_Self *)__x,
                              (_Self *)CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30)
                             );
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,in_RDX,in_RCX);
        local_81 = (bool)(bVar2 & 1);
      }
      else {
        std::_Rb_tree_const_iterator<std::pair<const_CKeyID,_XOnlyPubKey>_>::operator->
                  ((_Rb_tree_const_iterator<std::pair<const_CKeyID,_XOnlyPubKey>_> *)
                   in_stack_ffffffffffffff28);
        XOnlyPubKey::GetEvenCorrespondingCPubKey(this);
        memcpy(in_RCX,local_49,0x41);
        local_81 = true;
      }
    }
    else {
      ppVar4 = std::
               _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
               ::operator->((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>
                             *)in_stack_ffffffffffffff28);
      memcpy(in_RCX,&ppVar4->second,0x41);
      local_81 = true;
    }
  }
  else {
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
             ::operator->((_Rb_tree_const_iterator<std::pair<const_CKeyID,_std::pair<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
                           *)in_stack_ffffffffffffff28);
    memcpy(in_RCX,&ppVar3->second,0x41);
    local_81 = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_81;
  }
  __stack_chk_fail();
}

Assistant:

static bool GetPubKey(const SigningProvider& provider, const SignatureData& sigdata, const CKeyID& address, CPubKey& pubkey)
{
    // Look for pubkey in all partial sigs
    const auto it = sigdata.signatures.find(address);
    if (it != sigdata.signatures.end()) {
        pubkey = it->second.first;
        return true;
    }
    // Look for pubkey in pubkey lists
    const auto& pk_it = sigdata.misc_pubkeys.find(address);
    if (pk_it != sigdata.misc_pubkeys.end()) {
        pubkey = pk_it->second.first;
        return true;
    }
    const auto& tap_pk_it = sigdata.tap_pubkeys.find(address);
    if (tap_pk_it != sigdata.tap_pubkeys.end()) {
        pubkey = tap_pk_it->second.GetEvenCorrespondingCPubKey();
        return true;
    }
    // Query the underlying provider
    return provider.GetPubKey(address, pubkey);
}